

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O3

int lua_type(lua_State *L,int idx)

{
  uint uVar1;
  TValue *pTVar2;
  
  pTVar2 = index2adr(L,idx);
  uVar1 = 3;
  if (0xfffffffffffffff2 < (ulong)(pTVar2->it64 >> 0x2f)) {
    if (pTVar2 == (TValue *)((L->glref).ptr64 + 0xf8)) {
      uVar1 = 0xffffffff;
    }
    else {
      uVar1 = (uint)(0x75a0698042110 >> ((byte)(~(uint)(pTVar2->it64 >> 0x2f) << 2) & 0x3f)) & 0xf;
    }
  }
  return uVar1;
}

Assistant:

LUA_API int lua_type(lua_State *L, int idx)
{
  cTValue *o = index2adr(L, idx);
  if (tvisnumber(o)) {
    return LUA_TNUMBER;
#if LJ_64 && !LJ_GC64
  } else if (tvislightud(o)) {
    return LUA_TLIGHTUSERDATA;
#endif
  } else if (o == niltv(L)) {
    return LUA_TNONE;
  } else {  /* Magic internal/external tag conversion. ORDER LJ_T */
    uint32_t t = ~itype(o);
#if LJ_64
    int tt = (int)((U64x(75a06,98042110) >> 4*t) & 15u);
#else
    int tt = (int)(((t < 8 ? 0x98042110u : 0x75a06u) >> 4*(t&7)) & 15u);
#endif
    lj_assertL(tt != LUA_TNIL || tvisnil(o), "bad tag conversion");
    return tt;
  }
}